

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O3

void __thiscall
AI::SoundMap::injectSound
          (SoundMap *this,Vector2<float> originalPosition,float initialIntensity,AuditoryTag tag)

{
  value_type local_58;
  
  local_58.radius = 1;
  local_58.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.gridCoordinates = calcGridCoordinates(originalPosition,this->resolution,this->gridSize);
  local_58.id = this->nextSourceId;
  local_58.originalPosition = originalPosition;
  local_58.initialIntensity = initialIntensity;
  local_58.tag = tag;
  std::vector<AI::SoundSource,_std::allocator<AI::SoundSource>_>::push_back
            (&this->sources,&local_58);
  this->nextSourceId = this->nextSourceId + 1;
  if (local_58.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.blockedRanges.
                    super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.blockedRanges.
                          super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.blockedRanges.
                          super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SoundMap::injectSound(Vector2<float> originalPosition, float initialIntensity, AuditoryTag tag)
	{			
		SoundSource source;
		source.gridCoordinates = calcGridCoordinates(originalPosition, resolution, gridSize);
		source.originalPosition = originalPosition;
		source.id = nextSourceId;
		source.initialIntensity = initialIntensity;
		source.tag = tag;

		sources.push_back(source);
		nextSourceId++;
	}